

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::MarkItemEdited(ImGuiID id)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  GImGui->ActiveIdHasBeenEdited = true;
  pIVar1 = &(pIVar2->CurrentWindow->DC).LastItemStatusFlags;
  *pIVar1 = *pIVar1 | 4;
  return;
}

Assistant:

void ImGui::MarkItemEdited(ImGuiID id)
{
    // This marking is solely to be able to provide info for IsItemDeactivatedAfterEdit().
    // ActiveId might have been released by the time we call this (as in the typical press/release button behavior) but still need need to fill the data.
    (void)id; // Avoid unused variable warnings when asserts are compiled out.
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == id || g.ActiveId == 0 || g.DragDropActive);
    //IM_ASSERT(g.CurrentWindow->DC.LastItemId == id);
    g.ActiveIdHasBeenEdited = true;
    g.CurrentWindow->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;
}